

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void xLearn::pred_thread(DMatrix *matrix,Model *model,vector<float,_std::allocator<float>_> *pred,
                        Score *score_func_,bool is_norm,size_t start_idx,size_t end_idx)

{
  ostream *poVar1;
  ostream *poVar2;
  const_reference ppvVar3;
  const_reference pvVar4;
  reference pvVar5;
  long *in_RCX;
  vector<float,_std::allocator<float>_> *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  byte in_R8B;
  size_type in_R9;
  value_type vVar6;
  ulong in_stack_00000008;
  real_t norm;
  SparseRow *row;
  size_t i;
  string *function;
  int in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  value_type pvVar7;
  undefined8 in_stack_ffffffffffffff60;
  LogSeverity severity;
  allocator local_91;
  string local_90 [55];
  undefined1 local_59 [37];
  Logger local_34;
  ulong local_30;
  byte local_21;
  long *local_20;
  vector<float,_std::allocator<float>_> *local_18;
  undefined8 local_10;
  long local_8;
  
  severity = (LogSeverity)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_R9 <= in_stack_00000008) {
    for (; in_R9 < in_stack_00000008; in_R9 = in_R9 + 1) {
      ppvVar3 = std::
                vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                              *)(local_8 + 0x18),in_R9);
      pvVar7 = *ppvVar3;
      if ((local_21 & 1) == 0) {
        vVar6 = 1.0;
      }
      else {
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_8 + 0x48),in_R9);
        vVar6 = *pvVar4;
      }
      vVar6 = (value_type)(**(code **)(*local_20 + 0x18))(vVar6,local_20,pvVar7,local_10);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](local_18,in_R9);
      *pvVar5 = vVar6;
    }
    return;
  }
  local_30 = in_R9;
  Logger::Logger(&local_34,ERR);
  function = (string *)local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_59 + 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.cc"
             ,(allocator *)function);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"pred_thread",&local_91);
  poVar1 = Logger::Start(severity,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,function);
  poVar1 = std::operator<<(poVar1,"CHECK_GE failed ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/loss.cc"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x2a);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"end_idx");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_stack_00000008);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"start_idx");
  poVar1 = std::operator<<(poVar1," = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar1,local_30);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  Logger::~Logger((Logger *)poVar1);
  abort();
}

Assistant:

void pred_thread(const DMatrix* matrix,
                 Model* model,
                 std::vector<real_t>* pred,
                 Score* score_func_,
                 bool is_norm,
                 size_t start_idx,
                 size_t end_idx) {
  CHECK_GE(end_idx, start_idx);
  for (size_t i = start_idx; i < end_idx; ++i) {
    SparseRow* row = matrix->row[i];
    real_t norm = is_norm ? matrix->norm[i] : 1.0;
    (*pred)[i] = score_func_->CalcScore(row, *model, norm);
  }
}